

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wu32_width(OutputFile *this,uint32_t n,int w)

{
  OutputFragment *pOVar1;
  
  pOVar1 = ((this->blocks).
            super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->fragments).
           super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1];
  *(long *)(&pOVar1->field_0x18 + *(long *)(*(long *)&pOVar1->stream + -0x18)) = (long)w;
  std::ostream::_M_insert<unsigned_long>((ulong)&pOVar1->stream);
  return this;
}

Assistant:

OutputFile & OutputFile::wu32_width (uint32_t n, int w)
{
	stream () << std::setw (w);
	stream () << n;
	return *this;
}